

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O3

int put_string(char *dest,char *news,int where)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  
  sVar2 = strlen(news);
  uVar1 = (uint)sVar2;
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      dest[uVar3 + (long)where] = news[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uVar1 & 0x7fffffff) != uVar3);
  }
  dest[(int)(where + uVar1)] = '\0';
  return where + uVar1;
}

Assistant:

int
put_string(char *dest, const char *news, int where)
{
  int len = strlen(news);
  int i, cnt;
  for (i = where, cnt = 0; cnt < len; i++, cnt++)
    dest[i] = news[cnt];
  dest[where + len] = 0; //string terminator
  return where + len;    // index of the 0
}